

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O0

void __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_>::WriteFunctions
          (NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  NLHeader *pNVar4;
  FeederType *this_00;
  char *pcVar5;
  NLWriter2<mp::NLWriter2Params<mp::BinaryFormatter,_mp::NLW2_NLFeeder_C_Impl>_> *in_RDI;
  FuncDef func;
  int i;
  FuncDef local_d;
  uint local_c;
  
  local_c = 0;
  while( true ) {
    uVar1 = local_c;
    pNVar4 = Hdr(in_RDI);
    if ((pNVar4->super_NLProblemInfo).super_NLProblemInfo_C.num_funcs <= (int)uVar1) break;
    this_00 = Feeder(in_RDI);
    NLW2_NLFeeder_C_Impl::Function(this_00,local_c);
    uVar1 = local_c;
    uVar2 = NLFeeder<mp::NLW2_NLFeeder_C_Impl,_void_*>::FuncDef::Type(&local_d);
    uVar3 = NLFeeder<mp::NLW2_NLFeeder_C_Impl,_void_*>::FuncDef::NumArgs(&local_d);
    pcVar5 = NLFeeder<mp::NLW2_NLFeeder_C_Impl,_void_*>::FuncDef::Name(&local_d);
    BinaryFormatter::apr
              (&in_RDI->super_FormatterType,&in_RDI->nm,"F%d %d %d %s\n",(ulong)uVar1,(ulong)uVar2,
               (ulong)uVar3,pcVar5);
    local_c = local_c + 1;
  }
  return;
}

Assistant:

void NLWriter2<Params>::WriteFunctions() {
  for (int i=0; i<Hdr().num_funcs; ++i) {
    auto func = Feeder().Function(i);
    apr(nm, "F%d %d %d %s\n", i,
        (int)func.Type(),
        (int)func.NumArgs(),
        func.Name());
  }
}